

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O0

int Pdr_SetContains(Pdr_Set_t *pOld,Pdr_Set_t *pNew)

{
  int *local_30;
  int *pNewInt;
  int *pOldInt;
  Pdr_Set_t *pNew_local;
  Pdr_Set_t *pOld_local;
  
  if (pOld->nLits < 1) {
    __assert_fail("pOld->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                  ,0x181,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
  }
  if (pNew->nLits < 1) {
    __assert_fail("pNew->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                  ,0x182,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
  }
  if (pOld->nLits < pNew->nLits) {
    pOld_local._4_4_ = 0;
  }
  else if ((pOld->Sign & pNew->Sign) == pNew->Sign) {
    pNewInt = &pOld->nLits + pOld->nLits;
    local_30 = &pNew->nLits + pNew->nLits;
    while (&pNew->field_0x14 <= local_30) {
      if (pNewInt < &pOld->field_0x14) {
        return 0;
      }
      if (*local_30 == -1) {
        __assert_fail("*pNewInt != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                      ,0x18d,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
      }
      if (*pNewInt == -1) {
        __assert_fail("*pOldInt != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrUtil.c"
                      ,0x18e,"int Pdr_SetContains(Pdr_Set_t *, Pdr_Set_t *)");
      }
      if (*local_30 == *pNewInt) {
        local_30 = local_30 + -1;
      }
      else if (*pNewInt <= *local_30) {
        return 0;
      }
      pNewInt = pNewInt + -1;
    }
    pOld_local._4_4_ = 1;
  }
  else {
    pOld_local._4_4_ = 0;
  }
  return pOld_local._4_4_;
}

Assistant:

int Pdr_SetContains( Pdr_Set_t * pOld, Pdr_Set_t * pNew )
{
    int * pOldInt, * pNewInt;
    assert( pOld->nLits > 0 );
    assert( pNew->nLits > 0 );
    if ( pOld->nLits < pNew->nLits )
        return 0;
    if ( (pOld->Sign & pNew->Sign) != pNew->Sign )
        return 0;
    pOldInt = pOld->Lits + pOld->nLits - 1;
    pNewInt = pNew->Lits + pNew->nLits - 1;
    while ( pNew->Lits <= pNewInt )
    {
        if ( pOld->Lits > pOldInt )
            return 0;
        assert( *pNewInt != -1 );
        assert( *pOldInt != -1 );
        if ( *pNewInt == *pOldInt )
            pNewInt--, pOldInt--;
        else if ( *pNewInt < *pOldInt )
            pOldInt--;
        else
            return 0;
    }
    return 1;
}